

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O0

void __thiscall
vera::HaveDefines::addDefine(HaveDefines *this,string *_define,float *_value,int _nValues)

{
  vec<4,_float,_(glm::qualifier)0> local_58;
  vec<3,_float,_(glm::qualifier)0> local_48;
  vec<3,_float,_(glm::qualifier)0> local_38;
  vec<2,_float,_(glm::qualifier)0> local_2c;
  int local_24;
  float *pfStack_20;
  int _nValues_local;
  float *_value_local;
  string *_define_local;
  HaveDefines *this_local;
  
  local_24 = _nValues;
  pfStack_20 = _value;
  _value_local = (float *)_define;
  _define_local = (string *)this;
  if (_nValues == 1) {
    (*this->_vptr_HaveDefines[3])((ulong)(uint)*_value,this,_define);
  }
  else if (_nValues == 2) {
    glm::vec<2,_float,_(glm::qualifier)0>::vec(&local_2c,*_value,_value[1]);
    (*this->_vptr_HaveDefines[5])(local_2c,this,_define);
  }
  else if (_nValues == 3) {
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_38,*_value,_value[1],_value[2]);
    local_48.field_2 = local_38.field_2;
    local_48.field_0 = local_38.field_0;
    local_48.field_1 = local_38.field_1;
    (*this->_vptr_HaveDefines[6])(local_38._0_8_,(ulong)(uint)local_38.field_2,this,_define);
  }
  else if (_nValues == 4) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec(&local_58,*_value,_value[1],_value[2],_value[3]);
    (*this->_vptr_HaveDefines[7])(local_58._0_8_,local_58._8_8_,this,_define);
  }
  return;
}

Assistant:

void HaveDefines::addDefine( const std::string& _define, float* _value, int _nValues) {
    if (_nValues == 1) {
        addDefine(_define, _value[0]);
    }
    else if (_nValues == 2) {
        addDefine(_define, glm::vec2(_value[0], _value[1]));
    }
    else if (_nValues == 3) {
        addDefine(_define, glm::vec3(_value[0], _value[1], _value[2]));
    }
    else if (_nValues == 4) {
        addDefine(_define, glm::vec4(_value[0], _value[1], _value[2], _value[3]));
    }
}